

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_htmlspecialchars_decode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  sxi32 sVar4;
  char *pcVar5;
  char *zLeft;
  uint uVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  long lStack_50;
  uint local_3c;
  int nLen;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    jx9_result_null(pCtx);
  }
  else {
    pcVar5 = jx9_value_to_string(*apArg,&nLen);
    iVar2 = nLen;
    lVar9 = (long)nLen;
    if (nArg == 1) {
      local_3c = 0;
    }
    else {
      uVar6 = jx9_value_to_int(apArg[1]);
      local_3c = 0;
      if (-1 < (int)uVar6) {
        local_3c = uVar6;
      }
    }
    pcVar7 = pcVar5 + lVar9;
    iVar1 = (int)pcVar5;
    while (pcVar5 < pcVar7) {
      iVar8 = 0;
      for (zLeft = pcVar5; (zLeft < pcVar7 && (*zLeft != '&')); zLeft = zLeft + 1) {
        iVar8 = iVar8 + 1;
      }
      if (pcVar5 < zLeft) {
        jx9_result_string(pCtx,pcVar5,iVar8);
      }
      iVar3 = (iVar2 + iVar1) - (int)pcVar5;
      uVar6 = iVar3 - iVar8;
      nLen = uVar6;
      if ((int)uVar6 < 5) {
        if (iVar3 + -4 == iVar8) goto LAB_0012aa2f;
        if ((int)uVar6 < 1) {
          return 0;
        }
        goto LAB_0012aab9;
      }
      sVar4 = SyStrnicmp(zLeft,"&amp;",5);
      if (sVar4 == 0) {
        jx9_result_string(pCtx,"&",1);
        lStack_50 = 5;
      }
      else {
LAB_0012aa2f:
        sVar4 = SyStrnicmp(zLeft,"&lt;",4);
        if (sVar4 == 0) {
          pcVar5 = "<";
        }
        else {
          sVar4 = SyStrnicmp(zLeft,"&gt;",4);
          if (sVar4 != 0) {
            if (uVar6 < 6) {
LAB_0012aab9:
              jx9_result_string(pCtx,"&",1);
              lStack_50 = 1;
            }
            else {
              iVar8 = 6;
              sVar4 = SyStrnicmp(zLeft,"&quot;",6);
              if (sVar4 == 0) {
                if ((local_3c & 4) == 0) {
                  pcVar5 = "\"";
LAB_0012ab27:
                  iVar8 = 1;
                }
                else {
                  pcVar5 = "&quot;";
                }
              }
              else {
                sVar4 = SyStrnicmp(zLeft,"&#039;",6);
                if (sVar4 != 0) goto LAB_0012aab9;
                if ((local_3c & 2) != 0) {
                  pcVar5 = "\'";
                  goto LAB_0012ab27;
                }
                pcVar5 = "&#039;";
                iVar8 = 6;
              }
              jx9_result_string(pCtx,pcVar5,iVar8);
              lStack_50 = 6;
            }
            goto LAB_0012aaf0;
          }
          pcVar5 = ">";
        }
        jx9_result_string(pCtx,pcVar5,1);
        lStack_50 = 4;
      }
LAB_0012aaf0:
      pcVar5 = zLeft + lStack_50;
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_htmlspecialchars_decode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zCur, *zIn, *zEnd;
	int iFlags = 0x01; /* ENT_COMPAT */
	int nLen, nJump;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	/* Extract the flags if available */
	if( nArg > 1 ){
		iFlags = jx9_value_to_int(apArg[1]);
		if( iFlags < 0 ){
			iFlags = 0x01;
		}
	}
	/* Perform the requested operation */
	for(;;){
		if( zIn >= zEnd ){
			break;
		}
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '&' ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Append the raw string verbatim */
			jx9_result_string(pCtx, zCur, (int)(zIn-zCur));
		}
		nLen = (int)(zEnd-zIn);
		nJump = (int)sizeof(char);
		if( nLen >= (int)sizeof("&amp;")-1 && SyStrnicmp(zIn, "&amp;", sizeof("&amp;")-1) == 0 ){
			/* &amp; ==> '&' */
			jx9_result_string(pCtx, "&", (int)sizeof(char));
			nJump = (int)sizeof("&amp;")-1;
		}else if( nLen >= (int)sizeof("&lt;")-1 && SyStrnicmp(zIn, "&lt;", sizeof("&lt;")-1) == 0 ){
			/* &lt; ==> < */
			jx9_result_string(pCtx, "<", (int)sizeof(char));
			nJump = (int)sizeof("&lt;")-1; 
		}else if( nLen >= (int)sizeof("&gt;")-1 && SyStrnicmp(zIn, "&gt;", sizeof("&gt;")-1) == 0 ){
			/* &gt; ==> '>' */
			jx9_result_string(pCtx, ">", (int)sizeof(char));
			nJump = (int)sizeof("&gt;")-1; 
		}else if( nLen >= (int)sizeof("&quot;")-1 && SyStrnicmp(zIn, "&quot;", sizeof("&quot;")-1) == 0 ){
			/* &quot; ==> '"' */
			if( (iFlags & 0x04) == 0 /*ENT_NOQUOTES*/ ){
				jx9_result_string(pCtx, "\"", (int)sizeof(char));
			}else{
				/* Leave untouched */
				jx9_result_string(pCtx, "&quot;", (int)sizeof("&quot;")-1);
			}
			nJump = (int)sizeof("&quot;")-1;
		}else if( nLen >= (int)sizeof("&#039;")-1 && SyStrnicmp(zIn, "&#039;", sizeof("&#039;")-1) == 0 ){
			/* &#039; ==> ''' */
			if( iFlags & 0x02 /*ENT_QUOTES*/ ){
				/* Expand ''' */
				jx9_result_string(pCtx, "'", (int)sizeof(char));
			}else{
				/* Leave untouched */
				jx9_result_string(pCtx, "&#039;", (int)sizeof("&#039;")-1);
			}
			nJump = (int)sizeof("&#039;")-1;
		}else if( nLen >= (int)sizeof(char) ){
			/* expand '&' */
			jx9_result_string(pCtx, "&", (int)sizeof(char));
		}else{
			/* No more input to process */
			break;
		}
		zIn += nJump;
	}
	return JX9_OK;
}